

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O3

void bit_writer_write_1(bit_writer_t *w,uint8_t val)

{
  uint uVar1;
  byte bVar2;
  uint8_t uVar3;
  
  bVar2 = val & 1 | w->current_byte;
  uVar1 = w->current_byte_len + 1;
  w->current_byte_len = uVar1;
  if (uVar1 == 8) {
    w->bytes[w->byte_index] = bVar2;
    w->byte_index = w->byte_index + 1;
    w->current_byte_len = 0;
    uVar3 = '\0';
  }
  else {
    uVar3 = bVar2 * '\x02';
  }
  w->current_byte = uVar3;
  return;
}

Assistant:

void bit_writer_write_1(bit_writer_t *w, uint8_t val) {
    w->current_byte |= val & 1;
    w->current_byte_len++;

    if (w->current_byte_len == 8) {
        // 8 bits in a byte -- move to the next byte
        w->bytes[w->byte_index] = w->current_byte;
        w->byte_index++;
        w->current_byte_len = 0;
        w->current_byte = 0;
    } else {
        w->current_byte <<= 1;
    }
}